

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

_tExecReaction __thiscall yactfr::internal::Vm::_execSetPktInfo(Vm *this,Instr *param_1)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  Instr *param_1_local;
  Vm *this_local;
  
  boost::optional<unsigned_long_long>::operator=(&(this->_pos).elems.pktInfo._expectedTotalLen);
  boost::optional<unsigned_long_long>::operator=(&(this->_pos).elems.pktInfo._expectedContentLen);
  uVar1 = (this->_pos).curExpectedPktTotalLenBits;
  uVar2 = std::numeric_limits<unsigned_long_long>::max();
  if (uVar1 != uVar2) {
    boost::optional<unsigned_long_long>::operator=
              (&(this->_pos).elems.pktInfo._expectedTotalLen,
               &(this->_pos).curExpectedPktTotalLenBits);
  }
  uVar1 = (this->_pos).curExpectedPktContentLenBits;
  uVar2 = std::numeric_limits<unsigned_long_long>::max();
  if (uVar1 != uVar2) {
    boost::optional<unsigned_long_long>::operator=
              (&(this->_pos).elems.pktInfo._expectedContentLen,
               &(this->_pos).curExpectedPktContentLenBits);
  }
  _updateItForUser(this,&(this->_pos).elems.pktInfo.super_Element);
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execSetPktInfo(const Instr&)
{
    _pos.elems.pktInfo._expectedTotalLen = boost::none;
    _pos.elems.pktInfo._expectedContentLen = boost::none;

    if (_pos.curExpectedPktTotalLenBits != std::numeric_limits<Size>::max()) {
        _pos.elems.pktInfo._expectedTotalLen = _pos.curExpectedPktTotalLenBits;
    }

    if (_pos.curExpectedPktContentLenBits != std::numeric_limits<Size>::max()) {
        _pos.elems.pktInfo._expectedContentLen = _pos.curExpectedPktContentLenBits;
    }
    this->_updateItForUser(_pos.elems.pktInfo);
    return _tExecReaction::FetchNextInstrAndStop;
}